

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Mocap::ArchiveOUT(ChFunction_Mocap *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Mocap>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30 = &this->samp_freq;
  local_38 = "samp_freq";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (double *)&this->samples;
  local_38 = "samples";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_30 = &this->timetot;
  local_38 = "timetot";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Mocap::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Mocap>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    ////marchive << CHNVP(array_y);
    ////marchive << CHNVP(array_y_dt);
    ////marchive << CHNVP(array_y_dtdt);
    marchive << CHNVP(samp_freq);
    marchive << CHNVP(samples);
    marchive << CHNVP(timetot);
}